

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O1

void duckdb_brotli::BrotliStoreHuffmanTree
               (uint8_t *depths,size_t num,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  uint8_t code_length_bitdepth [18];
  size_t huffman_tree_size;
  uint32_t huffman_tree_histogram [18];
  uint16_t code_length_bitdepth_symbols [18];
  uint8_t huffman_tree [704];
  uint8_t huffman_tree_extra_bits [704];
  byte local_668 [32];
  ulong *local_648;
  size_t local_640;
  uint32_t local_638 [20];
  uint16_t local_5e8 [24];
  byte local_5b8 [704];
  byte local_2f8 [712];
  
  uVar10 = 0;
  local_640 = 0;
  local_668[0] = 0;
  local_668[1] = 0;
  local_668[2] = 0;
  local_668[3] = 0;
  local_668[4] = 0;
  local_668[5] = 0;
  local_668[6] = 0;
  local_668[7] = 0;
  local_668[8] = 0;
  local_668[9] = 0;
  local_668[10] = 0;
  local_668[0xb] = 0;
  local_668[0xc] = 0;
  local_668[0xd] = 0;
  local_668[0xe] = 0;
  local_668[0xf] = 0;
  local_668[0x10] = 0;
  local_668[0x11] = 0;
  local_638[0x10] = 0;
  local_638[0x11] = 0;
  local_638[0xc] = 0;
  local_638[0xd] = 0;
  local_638[0xe] = 0;
  local_638[0xf] = 0;
  local_638[8] = 0;
  local_638[9] = 0;
  local_638[10] = 0;
  local_638[0xb] = 0;
  local_638[4] = 0;
  local_638[5] = 0;
  local_638[6] = 0;
  local_638[7] = 0;
  local_638[0] = 0;
  local_638[1] = 0;
  local_638[2] = 0;
  local_638[3] = 0;
  local_648 = storage_ix;
  BrotliWriteHuffmanTree(depths,num,&local_640,local_5b8,local_2f8);
  if (local_640 != 0) {
    sVar4 = 0;
    do {
      local_638[local_5b8[sVar4]] = local_638[local_5b8[sVar4]] + 1;
      sVar4 = sVar4 + 1;
    } while (local_640 != sVar4);
  }
  lVar5 = 0;
  lVar9 = 0;
  do {
    lVar2 = lVar5;
    if ((local_638[lVar9] != 0) && (bVar11 = uVar10 != 0, uVar10 = 1, lVar2 = lVar9, bVar11)) {
      uVar10 = 2;
      break;
    }
    lVar5 = lVar2;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x12);
  uVar8 = 0x12;
  BrotliCreateHuffmanTree(local_638,0x12,5,tree,local_668);
  BrotliConvertBitDepthsToSymbols(local_668,0x12,local_5e8);
  if (1 < uVar10) {
    uVar8 = 0x12;
    do {
      if (local_668[(byte)kStaticDistanceCodeBits[uVar8 + 0x7f]] != 0) goto LAB_011426ab;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    uVar8 = 0;
  }
LAB_011426ab:
  uVar3 = (ulong)(local_668[3] == '\0') + 2;
  if (local_668[2] != '\0' || local_668[1] != '\0') {
    uVar3 = 0;
  }
  uVar6 = *local_648;
  *(ulong *)(storage + (uVar6 >> 3)) = uVar3 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
  uVar6 = uVar6 + 2;
  *local_648 = uVar6;
  if (uVar3 < uVar8) {
    do {
      uVar7 = *(byte *)((long)&BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(int,unsigned_char_const*,unsigned_long*,unsigned_char*)
                               ::kHuffmanBitLengthHuffmanCodeBitLengths +
                       (ulong)local_668[(byte)(&BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(int,unsigned_char_const*,unsigned_long*,unsigned_char*)
                                                ::kStorageOrder)[uVar3]]) + uVar6;
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)*(byte *)((long)&BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(int,unsigned_char_const*,unsigned_long*,unsigned_char*)
                                   ::kHuffmanBitLengthHuffmanCodeSymbols +
                           (ulong)local_668[(byte)(&
                                                  BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(int,unsigned_char_const*,unsigned_long*,unsigned_char*)
                                                  ::kStorageOrder)[uVar3]]) << ((byte)uVar6 & 7) |
           (ulong)storage[uVar6 >> 3];
      uVar3 = uVar3 + 1;
      uVar6 = uVar7;
    } while (uVar8 != uVar3);
    *local_648 = uVar7;
  }
  if (uVar10 == 1) {
    local_668[lVar5] = 0;
  }
  if (local_640 != 0) {
    sVar4 = 0;
    uVar8 = *local_648;
    do {
      bVar1 = local_5b8[sVar4];
      uVar3 = local_668[bVar1] + uVar8;
      *(ulong *)(storage + (uVar8 >> 3)) =
           (ulong)local_5e8[bVar1] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
      if (bVar1 == 0x10) {
        lVar9 = 2;
LAB_011427ab:
        *(ulong *)(storage + (uVar3 >> 3)) =
             (ulong)local_2f8[sVar4] << ((byte)uVar3 & 7) | (ulong)storage[uVar3 >> 3];
        uVar3 = uVar3 + lVar9;
      }
      else if (bVar1 == 0x11) {
        lVar9 = 3;
        goto LAB_011427ab;
      }
      sVar4 = sVar4 + 1;
      uVar8 = uVar3;
    } while (local_640 != sVar4);
    *local_648 = uVar3;
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliStoreHuffmanTree(const uint8_t* depths, size_t num,
                            HuffmanTree* tree,
                            size_t* storage_ix, uint8_t* storage) {
  /* Write the Huffman tree into the brotli-representation.
     The command alphabet is the largest, so this allocation will fit all
     alphabets. */
  /* TODO(eustas): fix me */
  uint8_t huffman_tree[BROTLI_NUM_COMMAND_SYMBOLS];
  uint8_t huffman_tree_extra_bits[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t huffman_tree_size = 0;
  uint8_t code_length_bitdepth[BROTLI_CODE_LENGTH_CODES] = { 0 };
  uint16_t code_length_bitdepth_symbols[BROTLI_CODE_LENGTH_CODES];
  uint32_t huffman_tree_histogram[BROTLI_CODE_LENGTH_CODES] = { 0 };
  size_t i;
  int num_codes = 0;
  size_t code = 0;

  BROTLI_DCHECK(num <= BROTLI_NUM_COMMAND_SYMBOLS);

  BrotliWriteHuffmanTree(depths, num, &huffman_tree_size, huffman_tree,
                         huffman_tree_extra_bits);

  /* Calculate the statistics of the Huffman tree in brotli-representation. */
  for (i = 0; i < huffman_tree_size; ++i) {
    ++huffman_tree_histogram[huffman_tree[i]];
  }

  for (i = 0; i < BROTLI_CODE_LENGTH_CODES; ++i) {
    if (huffman_tree_histogram[i]) {
      if (num_codes == 0) {
        code = i;
        num_codes = 1;
      } else if (num_codes == 1) {
        num_codes = 2;
        break;
      }
    }
  }

  /* Calculate another Huffman tree to use for compressing both the
     earlier Huffman tree with. */
  BrotliCreateHuffmanTree(huffman_tree_histogram, BROTLI_CODE_LENGTH_CODES,
                          5, tree, code_length_bitdepth);
  BrotliConvertBitDepthsToSymbols(code_length_bitdepth,
                                  BROTLI_CODE_LENGTH_CODES,
                                  code_length_bitdepth_symbols);

  /* Now, we have all the data, let's start storing it */
  BrotliStoreHuffmanTreeOfHuffmanTreeToBitMask(num_codes, code_length_bitdepth,
                                               storage_ix, storage);

  if (num_codes == 1) {
    code_length_bitdepth[code] = 0;
  }

  /* Store the real Huffman tree now. */
  BrotliStoreHuffmanTreeToBitMask(huffman_tree_size,
                                  huffman_tree,
                                  huffman_tree_extra_bits,
                                  code_length_bitdepth,
                                  code_length_bitdepth_symbols,
                                  storage_ix, storage);
}